

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O0

ScriptFunctionType *
Js::ScriptFunctionType::New
          (FunctionProxy *proxy,DynamicTypeHandler *typeHandler,RecyclableObject *prototype,
          bool isShared)

{
  JavascriptMethod entryPoint;
  code *pcVar1;
  ScriptContext *scriptContext_00;
  RecyclableObject *prototype_00;
  bool bVar2;
  FunctionInfo *this;
  FunctionProxy *pFVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  ScriptFunctionType *this_00;
  ProxyEntryPointInfo *pPVar6;
  TrackAllocData local_58;
  ScriptContext *local_30;
  ScriptContext *scriptContext;
  RecyclableObject *pRStack_20;
  bool isShared_local;
  RecyclableObject *prototype_local;
  DynamicTypeHandler *typeHandler_local;
  FunctionProxy *proxy_local;
  
  scriptContext._7_1_ = isShared;
  pRStack_20 = prototype;
  prototype_local = (RecyclableObject *)typeHandler;
  typeHandler_local = (DynamicTypeHandler *)proxy;
  this = FunctionProxy::GetFunctionInfo(proxy);
  pFVar3 = FunctionInfo::GetFunctionProxy(this);
  if (pFVar3 != (FunctionProxy *)typeHandler_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
                                ,0x22,"(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy)",
                                "proxy->GetFunctionInfo()->GetFunctionProxy() == proxy");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_30 = FunctionProxy::GetScriptContext((FunctionProxy *)typeHandler_local);
  pRVar5 = ScriptContext::GetRecycler(local_30);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ScriptFunctionType.cpp"
             ,0x2c);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_58);
  this_00 = (ScriptFunctionType *)new<Memory::Recycler>(0x40,pRVar5,0x43c4b0);
  prototype_00 = pRStack_20;
  scriptContext_00 = local_30;
  pPVar6 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)typeHandler_local);
  entryPoint = (JavascriptMethod)pPVar6->jsMethod;
  pPVar6 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)typeHandler_local);
  ScriptFunctionType(this_00,scriptContext_00,prototype_00,entryPoint,pPVar6,
                     (DynamicTypeHandler *)prototype_local,(bool)(scriptContext._7_1_ & 1),
                     (bool)(scriptContext._7_1_ & 1));
  return this_00;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, DynamicTypeHandler * typeHandler, RecyclableObject * prototype, bool isShared)
    {
        Assert(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy);
        ScriptContext * scriptContext = proxy->GetScriptContext();

        return RecyclerNew(scriptContext->GetRecycler(), ScriptFunctionType,
            scriptContext, 
            prototype,
            proxy->GetDefaultEntryPointInfo()->jsMethod,
            proxy->GetDefaultEntryPointInfo(),
            typeHandler,
            isShared, 
            isShared);
    }